

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

bool wasm_memory_grow(wasm_memory_t *memory,wasm_memory_pages_t delta)

{
  bool bVar1;
  Result result;
  Memory *this;
  wasm_memory_pages_t delta_local;
  wasm_memory_t *memory_local;
  
  this = wasm_ref_t::As<wabt::interp::Memory>((wasm_ref_t *)memory);
  result = wabt::interp::Memory::Grow(this,delta);
  bVar1 = wabt::Succeeded(result);
  return bVar1;
}

Assistant:

bool wasm_memory_grow(wasm_memory_t* memory, wasm_memory_pages_t delta) {
  return Succeeded(memory->As<Memory>()->Grow(delta));
}